

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRConsoleNode.cpp
# Opt level: O0

void __thiscall MinVR::VRConsoleNode::println(VRConsoleNode *this,string *output)

{
  ostream *this_00;
  string *in_RSI;
  long in_RDI;
  
  this_00 = std::operator<<(*(ostream **)(in_RDI + 0x70),in_RSI);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void VRConsoleNode::println(const std::string &output) {
	*m_stream << output << std::endl;
}